

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O1

void process_data_context_main
               (j_decompress_ptr cinfo,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  int *piVar1;
  int iVar2;
  jpeg_d_main_controller *pjVar3;
  jpeg_d_main_controller *pjVar4;
  long lVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  jpeg_component_info *pjVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pjVar3 = cinfo->main;
  if (*(int *)&pjVar3[6].start_pass == 0) {
    iVar9 = (*cinfo->coef->decompress_data)
                      (cinfo,(JSAMPIMAGE)(&pjVar3[6].process_data)[*(int *)&pjVar3[7].process_data])
    ;
    if (iVar9 == 0) {
      return;
    }
    *(undefined4 *)&pjVar3[6].start_pass = 1;
    piVar1 = (int *)((long)&pjVar3[8].start_pass + 4);
    *piVar1 = *piVar1 + 1;
  }
  iVar9 = *(int *)((long)&pjVar3[7].process_data + 4);
  if (iVar9 != 0) {
    if (iVar9 == 1) goto LAB_00145bf9;
    if (iVar9 != 2) {
      return;
    }
    (*cinfo->post->post_process_data)
              (cinfo,(JSAMPIMAGE)(&pjVar3[6].process_data)[*(int *)&pjVar3[7].process_data],
               (JDIMENSION *)((long)&pjVar3[6].start_pass + 4),*(JDIMENSION *)&pjVar3[8].start_pass,
               output_buf,out_row_ctr,out_rows_avail);
    if (*(uint *)((long)&pjVar3[6].start_pass + 4) < *(uint *)&pjVar3[8].start_pass) {
      return;
    }
    *(undefined4 *)((long)&pjVar3[7].process_data + 4) = 0;
    if (out_rows_avail <= *out_row_ctr) {
      return;
    }
  }
  *(undefined4 *)((long)&pjVar3[6].start_pass + 4) = 0;
  iVar9 = cinfo->min_DCT_scaled_size;
  *(int *)&pjVar3[8].start_pass = iVar9 + -1;
  auVar8 = _DAT_00160a40;
  auVar7 = _DAT_00160a30;
  if ((*(JDIMENSION *)((long)&pjVar3[8].start_pass + 4) == cinfo->total_iMCU_rows) &&
     (iVar2 = cinfo->num_components, 0 < (long)iVar2)) {
    pjVar18 = cinfo->comp_info;
    pjVar4 = cinfo->main;
    iVar10 = *(int *)&pjVar4[7].process_data;
    lVar19 = 0;
    do {
      uVar11 = pjVar18->DCT_scaled_size * pjVar18->v_samp_factor;
      iVar15 = (int)uVar11 / iVar9;
      uVar13 = pjVar18->downsampled_height % uVar11;
      if (uVar13 != 0) {
        uVar11 = uVar13;
      }
      if (lVar19 == 0) {
        *(int *)&pjVar4[8].start_pass = (int)(uVar11 - 1) / iVar15 + 1;
      }
      if (0 < iVar15) {
        lVar5 = *(long *)((&pjVar4[6].process_data)[iVar10] + lVar19 * 8);
        uVar13 = iVar15 * 2;
        if (iVar15 * 2 < 2) {
          uVar13 = 1;
        }
        lVar16 = (ulong)uVar13 - 1;
        auVar21._8_4_ = (int)lVar16;
        auVar21._0_8_ = lVar16;
        auVar21._12_4_ = (int)((ulong)lVar16 >> 0x20);
        lVar16 = lVar5 + (long)(int)uVar11 * 8;
        auVar21 = auVar21 ^ auVar8;
        lVar17 = 0;
        auVar22 = auVar7;
        do {
          auVar23 = auVar22 ^ auVar8;
          uVar6 = *(undefined8 *)(lVar5 + -8 + (long)(int)uVar11 * 8);
          if ((bool)(~(auVar21._4_4_ < auVar23._4_4_ ||
                      auVar21._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar21._4_4_) & 1)) {
            *(undefined8 *)(lVar16 + lVar17) = uVar6;
          }
          if (auVar23._12_4_ <= auVar21._12_4_ &&
              (auVar23._8_4_ <= auVar21._8_4_ || auVar23._12_4_ != auVar21._12_4_)) {
            *(undefined8 *)(lVar16 + 8 + lVar17) = uVar6;
          }
          lVar12 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 2;
          auVar22._8_8_ = lVar12 + 2;
          lVar17 = lVar17 + 0x10;
        } while ((ulong)(uVar13 + 1 & 0xfffffffe) << 3 != lVar17);
      }
      lVar19 = lVar19 + 1;
      pjVar18 = pjVar18 + 1;
    } while (lVar19 != iVar2);
  }
  *(undefined4 *)((long)&pjVar3[7].process_data + 4) = 1;
LAB_00145bf9:
  (*cinfo->post->post_process_data)
            (cinfo,(JSAMPIMAGE)(&pjVar3[6].process_data)[*(int *)&pjVar3[7].process_data],
             (JDIMENSION *)((long)&pjVar3[6].start_pass + 4),*(JDIMENSION *)&pjVar3[8].start_pass,
             output_buf,out_row_ctr,out_rows_avail);
  if (*(uint *)&pjVar3[8].start_pass <= *(uint *)((long)&pjVar3[6].start_pass + 4)) {
    if ((*(int *)((long)&pjVar3[8].start_pass + 4) == 1) &&
       (iVar9 = cinfo->num_components, 0 < (long)iVar9)) {
      iVar2 = cinfo->min_DCT_scaled_size;
      pjVar18 = cinfo->comp_info;
      pjVar4 = cinfo->main;
      lVar19 = 0;
      do {
        uVar20 = (long)(pjVar18->DCT_scaled_size * pjVar18->v_samp_factor) / (long)iVar2;
        iVar10 = (int)uVar20;
        if (0 < iVar10) {
          lVar5 = *(long *)(pjVar4[6].process_data + lVar19 * 8);
          lVar16 = *(long *)(pjVar4[7].start_pass + lVar19 * 8);
          lVar17 = (long)(iVar10 * (iVar2 + 1));
          uVar20 = uVar20 & 0xffffffff;
          lVar14 = (long)(iVar10 * (iVar2 + 2));
          lVar12 = 0;
          do {
            *(undefined8 *)(lVar5 + uVar20 * -8 + lVar12) =
                 *(undefined8 *)(lVar5 + lVar17 * 8 + lVar12);
            *(undefined8 *)(lVar16 + uVar20 * -8 + lVar12) =
                 *(undefined8 *)(lVar16 + lVar17 * 8 + lVar12);
            *(undefined8 *)(lVar5 + lVar14 * 8 + lVar12) = *(undefined8 *)(lVar5 + lVar12);
            *(undefined8 *)(lVar16 + lVar14 * 8 + lVar12) = *(undefined8 *)(lVar16 + lVar12);
            lVar12 = lVar12 + 8;
          } while (uVar20 * 8 != lVar12);
        }
        lVar19 = lVar19 + 1;
        pjVar18 = pjVar18 + 1;
      } while (lVar19 != iVar9);
    }
    *(byte *)&pjVar3[7].process_data = *(byte *)&pjVar3[7].process_data ^ 1;
    *(undefined4 *)&pjVar3[6].start_pass = 0;
    iVar9 = cinfo->min_DCT_scaled_size;
    *(int *)((long)&pjVar3[6].start_pass + 4) = iVar9 + 1;
    *(int *)&pjVar3[8].start_pass = iVar9 + 2;
    *(undefined4 *)((long)&pjVar3[7].process_data + 4) = 2;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_context_main(j_decompress_ptr cinfo, JSAMPARRAY output_buf,
                          JDIMENSION *out_row_ctr, JDIMENSION out_rows_avail)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;

  /* Read input data if we haven't filled the main buffer yet */
  if (!main_ptr->buffer_full) {
    if (!(*cinfo->coef->decompress_data) (cinfo,
                                          main_ptr->xbuffer[main_ptr->whichptr]))
      return;                   /* suspension forced, can do nothing more */
    main_ptr->buffer_full = TRUE;       /* OK, we have an iMCU row to work with */
    main_ptr->iMCU_row_ctr++;   /* count rows received */
  }

  /* Postprocessor typically will not swallow all the input data it is handed
   * in one call (due to filling the output buffer first).  Must be prepared
   * to exit and restart.  This switch lets us keep track of how far we got.
   * Note that each case falls through to the next on successful completion.
   */
  switch (main_ptr->context_state) {
  case CTX_POSTPONED_ROW:
    /* Call postprocessor using previously set pointers for postponed row */
    (*cinfo->post->post_process_data) (cinfo,
                                       main_ptr->xbuffer[main_ptr->whichptr],
                                       &main_ptr->rowgroup_ctr,
                                       main_ptr->rowgroups_avail, output_buf,
                                       out_row_ctr, out_rows_avail);
    if (main_ptr->rowgroup_ctr < main_ptr->rowgroups_avail)
      return;                   /* Need to suspend */
    main_ptr->context_state = CTX_PREPARE_FOR_IMCU;
    if (*out_row_ctr >= out_rows_avail)
      return;                   /* Postprocessor exactly filled output buf */
    FALLTHROUGH                 /*FALLTHROUGH*/
  case CTX_PREPARE_FOR_IMCU:
    /* Prepare to process first M-1 row groups of this iMCU row */
    main_ptr->rowgroup_ctr = 0;
    main_ptr->rowgroups_avail = (JDIMENSION)(cinfo->_min_DCT_scaled_size - 1);
    /* Check for bottom of image: if so, tweak pointers to "duplicate"
     * the last sample row, and adjust rowgroups_avail to ignore padding rows.
     */
    if (main_ptr->iMCU_row_ctr == cinfo->total_iMCU_rows)
      set_bottom_pointers(cinfo);
    main_ptr->context_state = CTX_PROCESS_IMCU;
    FALLTHROUGH                 /*FALLTHROUGH*/
  case CTX_PROCESS_IMCU:
    /* Call postprocessor using previously set pointers */
    (*cinfo->post->post_process_data) (cinfo,
                                       main_ptr->xbuffer[main_ptr->whichptr],
                                       &main_ptr->rowgroup_ctr,
                                       main_ptr->rowgroups_avail, output_buf,
                                       out_row_ctr, out_rows_avail);
    if (main_ptr->rowgroup_ctr < main_ptr->rowgroups_avail)
      return;                   /* Need to suspend */
    /* After the first iMCU, change wraparound pointers to normal state */
    if (main_ptr->iMCU_row_ctr == 1)
      set_wraparound_pointers(cinfo);
    /* Prepare to load new iMCU row using other xbuffer list */
    main_ptr->whichptr ^= 1;    /* 0=>1 or 1=>0 */
    main_ptr->buffer_full = FALSE;
    /* Still need to process last row group of this iMCU row, */
    /* which is saved at index M+1 of the other xbuffer */
    main_ptr->rowgroup_ctr = (JDIMENSION)(cinfo->_min_DCT_scaled_size + 1);
    main_ptr->rowgroups_avail = (JDIMENSION)(cinfo->_min_DCT_scaled_size + 2);
    main_ptr->context_state = CTX_POSTPONED_ROW;
  }
}